

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall
Json::StyledStreamWriter::writeCommentBeforeValue(StyledStreamWriter *this,Value *root)

{
  ostream *poVar1;
  bool bVar2;
  string local_58;
  string local_38;
  Value *local_18;
  Value *root_local;
  StyledStreamWriter *this_local;
  
  local_18 = root;
  root_local = (Value *)this;
  bVar2 = Value::hasComment(root,commentBefore);
  if (bVar2) {
    poVar1 = this->document_;
    Value::getComment_abi_cxx11_(&local_58,local_18,commentBefore);
    normalizeEOL(&local_38,&local_58);
    std::operator<<(poVar1,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::operator<<(this->document_,anon_var_dwarf_16a34f + 8);
  }
  return;
}

Assistant:

void 
StyledStreamWriter::writeCommentBeforeValue( const Value &root )
{
   if ( !root.hasComment( commentBefore ) )
      return;
   *document_ << normalizeEOL( root.getComment( commentBefore ) );
   *document_ << "\n";
}